

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

bstring blk2bstr(void *blk,int len)

{
  uint uVar1;
  bstring __ptr;
  uchar *__dest;
  ulong __n;
  
  if (-1 < len && blk != (void *)0x0) {
    __n = (ulong)(uint)len;
    __ptr = (bstring)malloc(0x10);
    if (__ptr != (bstring)0x0) {
      __ptr->slen = len;
      uVar1 = snapUpSize(len + 1 + (uint)(len == 0));
      __ptr->mlen = uVar1;
      __dest = (uchar *)malloc((ulong)uVar1);
      __ptr->data = __dest;
      if (__dest != (uchar *)0x0) {
        if (len == 0) {
          __n = 0;
        }
        else {
          memcpy(__dest,blk,__n);
        }
        __dest[__n] = '\0';
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring blk2bstr (const void * blk, int len) {
bstring b;
int i;

	if (blk == NULL || len < 0) return NULL;
	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL;
	b->slen = len;

	i = len + (2 - (len != 0));
	i = snapUpSize (i);

	b->mlen = i;

	b->data = (unsigned char *) bstr__alloc ((size_t) b->mlen);
	if (b->data == NULL) {
		bstr__free (b);
		return NULL;
	}

	if (len > 0) bstr__memcpy (b->data, blk, (size_t) len);
	b->data[len] = (unsigned char) '\0';

	return b;
}